

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

double cJSON_SetNumberHelper(cJSON *object,double number)

{
  int iVar1;
  
  iVar1 = 0x7fffffff;
  if ((number < 2147483647.0) && (iVar1 = -0x80000000, -2147483648.0 < number)) {
    iVar1 = (int)number;
  }
  object->valueint = iVar1;
  object->valuedouble = number;
  return number;
}

Assistant:

CJSON_PUBLIC(double) cJSON_SetNumberHelper(cJSON *object, double number)
{
    if (number >= INT_MAX)
    {
        object->valueint = INT_MAX;
    }
    else if (number <= (double)INT_MIN)
    {
        object->valueint = INT_MIN;
    }
    else
    {
        object->valueint = (int)number;
    }

    return object->valuedouble = number;
}